

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void Excel::Parser::handleFORMULA(Record *record,Stream *stream,size_t sheetIdx,IStorage *storage)

{
  BiffVersion in_R9D;
  vector<int,_std::allocator<int>_> borders;
  wstring local_238;
  Formula formula;
  Record stringRecord;
  
  Formula::Formula(&formula,record);
  if (formula.m_valueType == StringValue) {
    Record::Record(&stringRecord,stream);
    borders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    borders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    borders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    loadString_abi_cxx11_
              (&local_238,(Excel *)&stringRecord.m_stream,(Stream *)&borders,
               (vector<int,_std::allocator<int>_> *)0x2,0x600,in_R9D);
    std::__cxx11::wstring::_M_assign((wstring *)&formula.m_stringValue);
    std::__cxx11::wstring::~wstring((wstring *)&local_238);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&borders.super__Vector_base<int,_std::allocator<int>_>);
    Record::~Record(&stringRecord);
  }
  (*storage->_vptr_IStorage[8])(storage,sheetIdx,&formula);
  std::__cxx11::wstring::~wstring((wstring *)&formula.m_stringValue);
  return;
}

Assistant:

inline void
Parser::handleFORMULA( Record & record, Stream & stream, size_t sheetIdx, IStorage & storage )
{
	Formula formula( record );

	if( formula.valueType() == Formula::StringValue )
	{
		Record stringRecord( stream );

		std::vector< int32_t > borders;

		formula.setString( loadString( stringRecord.dataStream(), borders ) );
	}

	storage.onCell( sheetIdx, formula );
}